

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

void __thiscall FConfigFile::ClearKey(FConfigFile *this,char *key)

{
  int iVar1;
  bool bVar2;
  FConfigEntry *local_28;
  FConfigEntry *probe;
  FConfigEntry **prober;
  char *key_local;
  FConfigFile *this_local;
  
  if (this->CurrentSection->RootEntry != (FConfigEntry *)0x0) {
    probe = (FConfigEntry *)&this->CurrentSection->RootEntry;
    local_28 = *(FConfigEntry **)probe;
    while( true ) {
      bVar2 = false;
      if (local_28 != (FConfigEntry *)0x0) {
        iVar1 = strcasecmp(local_28->Key,key);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      probe = (FConfigEntry *)&local_28->Next;
      local_28 = *(FConfigEntry **)probe;
    }
    if (local_28 != (FConfigEntry *)0x0) {
      probe->Value = (char *)local_28->Next;
      if (this->CurrentSection->LastEntryPtr == &local_28->Next) {
        this->CurrentSection->LastEntryPtr = (FConfigEntry **)probe;
      }
      if (local_28->Value != (char *)0x0) {
        operator_delete__(local_28->Value);
      }
      if (local_28 != (FConfigEntry *)0x0) {
        operator_delete__(local_28);
      }
    }
  }
  return;
}

Assistant:

void FConfigFile::ClearKey(const char *key)
{
	if (CurrentSection->RootEntry == NULL)
	{
		return;
	}
	FConfigEntry **prober = &CurrentSection->RootEntry, *probe = *prober;

	while (probe != NULL && stricmp(probe->Key, key) != 0)
	{
		prober = &probe->Next;
		probe = *prober;
	}
	if (probe != NULL)
	{
		*prober = probe->Next;
		if (CurrentSection->LastEntryPtr == &probe->Next)
		{
			CurrentSection->LastEntryPtr = prober;
		}
		delete[] probe->Value;
		delete[] (char *)probe;
	}
}